

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteCord
          (CopyingOutputStreamAdaptor *this,Cord *cord)

{
  CordRepBtree **this_00;
  bool bVar1;
  uint uVar2;
  const_pointer pvVar3;
  size_type sVar4;
  undefined1 local_170 [8];
  string_view chunk;
  ChunkIterator __end2;
  ChunkIterator __begin2;
  ChunkRange *__range2;
  Cord *cord_local;
  CopyingOutputStreamAdaptor *this_local;
  
  __begin2.btree_reader_.navigator_.node_[0xb] =
       (CordRepBtree *)absl::lts_20250127::Cord::Chunks(cord);
  this_00 = __begin2.btree_reader_.navigator_.node_ + 0xb;
  absl::lts_20250127::Cord::ChunkRange::begin
            ((ChunkIterator *)(__end2.btree_reader_.navigator_.node_ + 0xb),(ChunkRange *)this_00);
  absl::lts_20250127::Cord::ChunkRange::end((ChunkIterator *)&chunk._M_str,(ChunkRange *)this_00);
  while( true ) {
    bVar1 = absl::lts_20250127::Cord::ChunkIterator::operator!=
                      ((ChunkIterator *)(__end2.btree_reader_.navigator_.node_ + 0xb),
                       (ChunkIterator *)&chunk._M_str);
    if (!bVar1) {
      return true;
    }
    _local_170 = absl::lts_20250127::Cord::ChunkIterator::operator*
                           ((ChunkIterator *)(__end2.btree_reader_.navigator_.node_ + 0xb));
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_170);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_170);
    uVar2 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[5])
                      (this,pvVar3,sVar4 & 0xffffffff);
    if ((uVar2 & 1) == 0) break;
    absl::lts_20250127::Cord::ChunkIterator::operator++
              ((ChunkIterator *)(__end2.btree_reader_.navigator_.node_ + 0xb));
  }
  return false;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteCord(const absl::Cord& cord) {
  for (absl::string_view chunk : cord.Chunks()) {
    if (!WriteAliasedRaw(chunk.data(), chunk.size())) {
      return false;
    }
  }
  return true;
}